

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O1

int __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxDelta(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *param_1,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val,int num,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *low,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *up)

{
  uint *puVar1;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  cpp_dec_float<100U,_int,_void> *pcVar14;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar15;
  long in_FS_OFFSET;
  Real a;
  ulong uVar16;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  uint local_278 [3];
  undefined3 uStack_26b;
  int iStack_268;
  bool bStack_264;
  ulong local_260;
  cpp_dec_float<100U,_int,_void> local_258;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  uint local_1d8 [3];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  undefined8 local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  uint local_198 [9];
  bool bStack_174;
  undefined8 local_170;
  cpp_dec_float<100U,_int,_void> *local_160;
  cpp_dec_float<100U,_int,_void> local_158;
  cpp_dec_float<100U,_int,_void> local_108;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  int *local_b0;
  undefined4 local_a8;
  uint uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  double local_98;
  undefined8 uStack_90;
  cpp_dec_float<100U,_int,_void> local_88;
  
  local_258.fpclass = cpp_dec_float_finite;
  local_258.prec_elem = 0x10;
  local_258.data._M_elems[0] = 0;
  local_258.data._M_elems[1] = 0;
  local_258.data._M_elems[2] = 0;
  local_258.data._M_elems[3] = 0;
  local_258.data._M_elems[4] = 0;
  local_258.data._M_elems[5] = 0;
  local_258.data._M_elems[6] = 0;
  local_258.data._M_elems[7] = 0;
  local_258.data._M_elems[8] = 0;
  local_258.data._M_elems[9] = 0;
  local_258.data._M_elems[10] = 0;
  local_258.data._M_elems[0xb] = 0;
  local_258.data._M_elems[0xc] = 0;
  local_258.data._M_elems[0xd] = 0;
  local_258.data._M_elems._56_5_ = 0;
  local_258.data._M_elems[0xf]._1_3_ = 0;
  local_258.exp = 0;
  local_258.neg = false;
  local_158.fpclass = cpp_dec_float_finite;
  local_158.prec_elem = 0x10;
  local_158.data._M_elems[0] = 0;
  local_158.data._M_elems[1] = 0;
  local_158.data._M_elems[2] = 0;
  local_158.data._M_elems[3] = 0;
  local_158.data._M_elems[4] = 0;
  local_158.data._M_elems[5] = 0;
  local_158.data._M_elems[6] = 0;
  local_158.data._M_elems[7] = 0;
  local_158.data._M_elems[8] = 0;
  local_158.data._M_elems[9] = 0;
  local_158.data._M_elems[10] = 0;
  local_158.data._M_elems[0xb] = 0;
  local_158.data._M_elems[0xc] = 0;
  local_158.data._M_elems[0xd] = 0;
  local_158.data._M_elems._56_5_ = 0;
  local_158.data._M_elems[0xf]._1_3_ = 0;
  local_158.exp = 0;
  local_158.neg = false;
  local_108.fpclass = cpp_dec_float_finite;
  local_108.prec_elem = 0x10;
  local_108.data._M_elems[0] = 0;
  local_108.data._M_elems[1] = 0;
  local_108.data._M_elems[2] = 0;
  local_108.data._M_elems[3] = 0;
  local_108.data._M_elems[4] = 0;
  local_108.data._M_elems[5] = 0;
  local_108.data._M_elems[6] = 0;
  local_108.data._M_elems[7] = 0;
  local_108.data._M_elems[8] = 0;
  local_108.data._M_elems[9] = 0;
  local_108.data._M_elems[10] = 0;
  local_108.data._M_elems[0xb] = 0;
  local_108.data._M_elems[0xc] = 0;
  local_108.data._M_elems[0xd] = 0;
  local_108.data._M_elems._56_5_ = 0;
  local_108.data._M_elems[0xf]._1_3_ = 0;
  local_108.exp = 0;
  local_108.neg = false;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 0x10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems[6] = 0;
  local_88.data._M_elems[7] = 0;
  local_88.data._M_elems[8] = 0;
  local_88.data._M_elems[9] = 0;
  local_88.data._M_elems[10] = 0;
  local_88.data._M_elems[0xb] = 0;
  local_88.data._M_elems[0xc] = 0;
  local_88.data._M_elems[0xd] = 0;
  local_88.data._M_elems._56_5_ = 0;
  local_88.data._M_elems[0xf]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_88,a);
  local_160 = (cpp_dec_float<100U,_int,_void> *)this;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  local_158.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_158.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_158.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_158.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_158.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_158.data._M_elems._40_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 10);
  local_158.data._M_elems._48_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xc);
  uVar3 = *(undefined8 *)((val->m_backend).data._M_elems + 0xe);
  local_158.data._M_elems._56_5_ = SUB85(uVar3,0);
  local_158.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
  local_158.exp = (val->m_backend).exp;
  local_158.neg = (val->m_backend).neg;
  local_158.fpclass = (val->m_backend).fpclass;
  local_158.prec_elem = (val->m_backend).prec_elem;
  local_b8 = val;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(&local_108,0);
  if (num != 0) {
    local_160 = &(((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&local_160->data)->delta).m_backend;
    local_98 = *(double *)(in_FS_OFFSET + -8);
    uStack_90 = 0;
    local_a8 = SUB84(local_98,0);
    uStack_a4 = (uint)((ulong)local_98 >> 0x20) ^ 0x80000000;
    uStack_a0 = 0;
    uStack_9c = 0x80000000;
    lVar15 = (long)num;
    local_b0 = idx;
    do {
      iVar13 = idx[lVar15 + -1];
      uVar3 = *(undefined8 *)upd[iVar13].m_backend.data._M_elems;
      uVar4 = *(undefined8 *)(upd[iVar13].m_backend.data._M_elems + 2);
      puVar1 = upd[iVar13].m_backend.data._M_elems + 4;
      uVar5 = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      puVar1 = upd[iVar13].m_backend.data._M_elems + 8;
      uVar7 = *(undefined8 *)puVar1;
      uVar8 = *(undefined8 *)(puVar1 + 2);
      puVar1 = upd[iVar13].m_backend.data._M_elems + 0xc;
      uVar9 = *(undefined8 *)puVar1;
      uVar10 = *(undefined8 *)(puVar1 + 2);
      local_258.data._M_elems[0xc] = (uint)uVar9;
      local_258.data._M_elems[0xd] = (uint)((ulong)uVar9 >> 0x20);
      local_258.data._M_elems._56_5_ = SUB85(uVar10,0);
      local_258.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
      local_258.data._M_elems[8] = (uint)uVar7;
      local_258.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
      local_258.data._M_elems[10] = (uint)uVar8;
      local_258.data._M_elems[0xb] = (uint)((ulong)uVar8 >> 0x20);
      local_258.data._M_elems[4] = (uint)uVar5;
      local_258.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
      local_258.data._M_elems[6] = (uint)uVar6;
      local_258.data._M_elems[7] = (uint)((ulong)uVar6 >> 0x20);
      local_258.data._M_elems[0] = (uint)uVar3;
      local_258.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
      local_258.data._M_elems[2] = (uint)uVar4;
      local_258.data._M_elems[3] = (uint)((ulong)uVar4 >> 0x20);
      local_258.exp = upd[iVar13].m_backend.exp;
      local_258.neg = upd[iVar13].m_backend.neg;
      local_258.fpclass = upd[iVar13].m_backend.fpclass;
      local_258.prec_elem = upd[iVar13].m_backend.prec_elem;
      if (((local_258.fpclass == 2) || (local_88.fpclass == cpp_dec_float_NaN)) ||
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_258,&local_88), iVar12 < 1)) {
        local_2a8._8_4_ = local_88.data._M_elems[2];
        local_2a8._12_4_ = local_88.data._M_elems[3];
        local_2a8._0_4_ = local_88.data._M_elems[0];
        local_2a8._4_4_ = local_88.data._M_elems[1];
        auVar11 = local_2a8;
        local_278[0] = local_88.data._M_elems[0xc];
        local_278[1] = local_88.data._M_elems[0xd];
        stack0xfffffffffffffd90 = local_88.data._M_elems._56_5_;
        uStack_26b = local_88.data._M_elems[0xf]._1_3_;
        local_288._8_4_ = local_88.data._M_elems[10];
        local_288._12_4_ = local_88.data._M_elems[0xb];
        local_288._0_4_ = local_88.data._M_elems[8];
        local_288._4_4_ = local_88.data._M_elems[9];
        local_298._8_4_ = local_88.data._M_elems[6];
        local_298._12_4_ = local_88.data._M_elems[7];
        local_298._0_4_ = local_88.data._M_elems[4];
        local_298._4_4_ = local_88.data._M_elems[5];
        iStack_268 = local_88.exp;
        bStack_264 = local_88.neg;
        local_260._0_4_ = local_88.fpclass;
        local_260._4_4_ = local_88.prec_elem;
        local_2a8._0_4_ = local_88.data._M_elems[0];
        if (local_2a8._0_4_ != 0 || local_88.fpclass != cpp_dec_float_finite) {
          bStack_264 = (bool)(local_88.neg ^ 1);
        }
        local_2a8 = auVar11;
        if (((local_88.fpclass != cpp_dec_float_NaN) && (local_258.fpclass != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_258,(cpp_dec_float<100U,_int,_void> *)local_2a8), iVar12 < 0)
           ) {
          local_2a8._4_4_ = local_258.data._M_elems[1];
          local_2a8._0_4_ = local_258.data._M_elems[0];
          local_2a8._12_4_ = local_258.data._M_elems[3];
          local_2a8._8_4_ = local_258.data._M_elems[2];
          local_298._4_4_ = local_258.data._M_elems[5];
          local_298._0_4_ = local_258.data._M_elems[4];
          local_298._12_4_ = local_258.data._M_elems[7];
          local_298._8_4_ = local_258.data._M_elems[6];
          local_288._4_4_ = local_258.data._M_elems[9];
          local_288._0_4_ = local_258.data._M_elems[8];
          local_288._12_4_ = local_258.data._M_elems[0xb];
          local_288._8_4_ = local_258.data._M_elems[10];
          local_278[1] = local_258.data._M_elems[0xd];
          local_278[0] = local_258.data._M_elems[0xc];
          stack0xfffffffffffffd90 = local_258.data._M_elems._56_5_;
          uStack_26b = local_258.data._M_elems[0xf]._1_3_;
          iStack_268 = local_258.exp;
          bStack_264 = local_258.neg;
          local_260._0_4_ = local_258.fpclass;
          local_260._4_4_ = local_258.prec_elem;
          if (local_258.data._M_elems[0] != 0 || local_258.fpclass != 0) {
            bStack_264 = (bool)(local_258.neg ^ 1);
          }
          if (((local_258.fpclass == 2) || (local_108.fpclass == cpp_dec_float_NaN)) ||
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_2a8,&local_108),
             iVar12 < 1)) {
            local_1b8._0_4_ = local_108.data._M_elems[1];
            local_1b8._4_4_ = local_108.data._M_elems[2];
            local_1b8._8_4_ = local_108.data._M_elems[3];
            local_1b8._12_4_ = local_108.data._M_elems[4];
            local_1a8._0_4_ = local_108.data._M_elems[5];
            local_1a8._4_4_ = local_108.data._M_elems[6];
            local_1a8._8_4_ = local_108.data._M_elems[7];
            local_1a8._12_4_ = local_108.data._M_elems[8];
            local_198[0] = local_108.data._M_elems[9];
            local_198[1] = local_108.data._M_elems[10];
            local_198[2] = local_108.data._M_elems[0xb];
            local_198[3] = local_108.data._M_elems[0xc];
            local_198[4] = local_108.data._M_elems[0xd];
            local_198[5] = local_108.data._M_elems[0xe];
            local_198[6] = (uint)(CONCAT35(local_108.data._M_elems[0xf]._1_3_,
                                           local_108.data._M_elems._56_5_) >> 0x20);
          }
          else {
            local_1b8._0_4_ = local_258.data._M_elems[1];
            local_1b8._4_4_ = local_258.data._M_elems[2];
            local_1b8._8_4_ = local_258.data._M_elems[3];
            local_1b8._12_4_ = local_258.data._M_elems[4];
            local_1a8._0_4_ = local_258.data._M_elems[5];
            local_1a8._4_4_ = local_258.data._M_elems[6];
            local_1a8._8_4_ = local_258.data._M_elems[7];
            local_1a8._12_4_ = local_258.data._M_elems[8];
            local_198[0] = local_258.data._M_elems[9];
            local_198[1] = local_258.data._M_elems[10];
            local_198[2] = local_258.data._M_elems[0xb];
            local_198[3] = local_258.data._M_elems[0xc];
            local_198[4] = local_258.data._M_elems[0xd];
            local_198[5] = local_258.data._M_elems[0xe];
            local_198[6] = (uint)(CONCAT35(local_258.data._M_elems[0xf]._1_3_,
                                           local_258.data._M_elems._56_5_) >> 0x20);
            local_108.neg =
                 (bool)((local_258.fpclass != 0 || local_258.data._M_elems[0] != 0) ^ local_258.neg)
            ;
            local_108.data._M_elems[0] = local_258.data._M_elems[0];
            local_108.exp = local_258.exp;
            local_108._72_8_ = local_258._72_8_;
          }
          local_108.data._M_elems[0xd] = local_198[4];
          local_108.data._M_elems._56_5_ = SUB85(CONCAT44(local_198[6],local_198[5]),0);
          local_108.data._M_elems[0xf]._1_3_ = (undefined3)(local_198[6] >> 8);
          local_108.data._M_elems[9] = local_198[0];
          local_108.data._M_elems[10] = local_198[1];
          local_108.data._M_elems[0xb] = local_198[2];
          local_108.data._M_elems[0xc] = local_198[3];
          local_108.data._M_elems[5] = local_1a8._0_4_;
          local_108.data._M_elems[6] = local_1a8._4_4_;
          local_108.data._M_elems[7] = local_1a8._8_4_;
          local_108.data._M_elems[8] = local_1a8._12_4_;
          local_108.data._M_elems[1] = local_1b8._0_4_;
          local_108.data._M_elems[2] = local_1b8._4_4_;
          local_108.data._M_elems[3] = local_1b8._8_4_;
          local_108.data._M_elems[4] = local_1b8._12_4_;
          pcVar14 = &low[iVar13].m_backend;
          local_1c0._0_4_ = cpp_dec_float_finite;
          local_1c0._4_4_ = 0x10;
          local_208 = (undefined1  [16])0x0;
          local_1f8 = (undefined1  [16])0x0;
          local_1e8 = (undefined1  [16])0x0;
          local_1d8[0] = 0;
          local_1d8[1] = 0;
          stack0xfffffffffffffe30 = 0;
          uStack_1cb = 0;
          iStack_1c8 = 0;
          bStack_1c4 = false;
          if ((cpp_dec_float<100U,_int,_void> *)local_208 == &vec[iVar13].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      ((cpp_dec_float<100U,_int,_void> *)local_208,pcVar14);
            if (local_208._0_4_ != 0 || (fpclass_type)local_1c0 != cpp_dec_float_finite) {
              bStack_1c4 = (bool)(bStack_1c4 ^ 1);
            }
          }
          else {
            if ((cpp_dec_float<100U,_int,_void> *)local_208 != pcVar14) {
              local_208 = *(undefined1 (*) [16])(pcVar14->data)._M_elems;
              local_1f8 = *(undefined1 (*) [16])((pcVar14->data)._M_elems + 4);
              local_1e8 = *(undefined1 (*) [16])((pcVar14->data)._M_elems + 8);
              local_1d8._0_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 0xc);
              uVar3 = *(undefined8 *)((pcVar14->data)._M_elems + 0xe);
              stack0xfffffffffffffe30 = (undefined5)uVar3;
              uStack_1cb = (undefined3)((ulong)uVar3 >> 0x28);
              iStack_1c8 = pcVar14->exp;
              bStack_1c4 = pcVar14->neg;
              local_1c0._0_4_ = pcVar14->fpclass;
              local_1c0._4_4_ = pcVar14->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      ((cpp_dec_float<100U,_int,_void> *)local_208,&vec[iVar13].m_backend);
          }
          auVar11 = local_1e8;
          local_170._0_4_ = cpp_dec_float_finite;
          local_170._4_4_ = 0x10;
          local_1b8 = (undefined1  [16])0x0;
          local_1a8 = (undefined1  [16])0x0;
          local_198[0] = 0;
          local_198[1] = 0;
          local_198[2] = 0;
          local_198[3] = 0;
          local_198[4] = 0;
          local_198[5] = 0;
          local_198[6] = 0;
          local_198[7] = 0;
          local_198[8] = 0;
          bStack_174 = false;
          if ((cpp_dec_float<100U,_int,_void> *)local_1b8 == local_160) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      ((cpp_dec_float<100U,_int,_void> *)local_1b8,
                       (cpp_dec_float<100U,_int,_void> *)local_208);
            if (local_1b8._0_4_ != 0 || (fpclass_type)local_170 != cpp_dec_float_finite) {
              bStack_174 = (bool)(bStack_174 ^ 1);
            }
          }
          else {
            local_198[4] = (uint)local_1d8._0_8_;
            local_198[5] = SUB84(local_1d8._0_8_,4);
            local_198[6] = (uint)stack0xfffffffffffffe30;
            local_198[7] = (uint)(CONCAT35(uStack_1cb,stack0xfffffffffffffe30) >> 0x20);
            local_198[0] = local_1e8._0_4_;
            local_198[1] = local_1e8._4_4_;
            local_198[2] = auVar11._8_4_;
            local_198[3] = auVar11._12_4_;
            local_1a8 = local_1f8;
            local_1b8 = local_208;
            local_198[8] = iStack_1c8;
            bStack_174 = bStack_1c4;
            local_170._0_4_ = (fpclass_type)local_1c0;
            local_170._4_4_ = local_1c0._4_4_;
            local_1e8 = auVar11;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      ((cpp_dec_float<100U,_int,_void> *)local_1b8,local_160);
          }
          local_260._0_4_ = cpp_dec_float_finite;
          local_260._4_4_ = 0x10;
          local_2a8 = (undefined1  [16])0x0;
          local_298 = (undefined1  [16])0x0;
          local_288 = (undefined1  [16])0x0;
          local_278[0] = 0;
          local_278[1] = 0;
          stack0xfffffffffffffd90 = 0;
          uStack_26b = 0;
          iStack_268 = 0;
          bStack_264 = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    ((cpp_dec_float<100U,_int,_void> *)local_2a8,
                     (cpp_dec_float<100U,_int,_void> *)local_1b8,&local_258);
          local_258.data._M_elems[0xc] = (uint)local_278._0_8_;
          local_258.data._M_elems[0xd] = SUB84(local_278._0_8_,4);
          local_258.data._M_elems._56_5_ = stack0xfffffffffffffd90;
          local_258.data._M_elems[0xf]._1_3_ = uStack_26b;
          local_258.data._M_elems[8] = local_288._0_4_;
          local_258.data._M_elems[9] = local_288._4_4_;
          local_258.data._M_elems[10] = local_288._8_4_;
          local_258.data._M_elems[0xb] = local_288._12_4_;
          local_258.data._M_elems[4] = local_298._0_4_;
          local_258.data._M_elems[5] = local_298._4_4_;
          local_258.data._M_elems[6] = local_298._8_4_;
          local_258.data._M_elems[7] = local_298._12_4_;
          local_258.data._M_elems[0] = local_2a8._0_4_;
          local_258.data._M_elems[1] = local_2a8._4_4_;
          local_258.data._M_elems[2] = local_2a8._8_4_;
          local_258.data._M_elems[3] = local_2a8._12_4_;
          local_258.exp = iStack_268;
          local_258.neg = bStack_264;
          local_258.fpclass = (fpclass_type)local_260;
          local_258.prec_elem = local_260._4_4_;
          if ((((fpclass_type)local_260 != cpp_dec_float_NaN) &&
              (local_158.fpclass != cpp_dec_float_NaN)) &&
             (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&local_258,&local_158), iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            local_260._0_4_ = cpp_dec_float_finite;
            local_260._4_4_ = 0x10;
            local_2a8 = ZEXT816(0);
            local_298 = ZEXT816(0);
            local_288 = ZEXT816(0);
            local_278[0] = 0;
            local_278[1] = 0;
            stack0xfffffffffffffd90 = 0;
            uStack_26b = 0;
            iStack_268 = 0;
            bStack_264 = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)local_2a8,
                       (double)CONCAT44(uStack_a4,local_a8));
            if (((pcVar14->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_260 != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar14,(cpp_dec_float<100U,_int,_void> *)local_2a8), 0 < iVar13
               )) goto LAB_00481c57;
          }
        }
      }
      else {
        bVar2 = false;
        if ((local_258.fpclass != cpp_dec_float_NaN) && (local_108.fpclass != cpp_dec_float_NaN)) {
          iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_258,&local_108);
          bVar2 = 0 < iVar12;
        }
        pcVar14 = &local_108;
        if (bVar2) {
          pcVar14 = &local_258;
        }
        uVar3 = *(undefined8 *)(pcVar14->data)._M_elems;
        uVar4 = *(undefined8 *)((pcVar14->data)._M_elems + 2);
        uVar5 = *(undefined8 *)((pcVar14->data)._M_elems + 4);
        uVar6 = *(undefined8 *)((pcVar14->data)._M_elems + 6);
        uVar7 = *(undefined8 *)((pcVar14->data)._M_elems + 8);
        uVar8 = *(undefined8 *)((pcVar14->data)._M_elems + 10);
        uVar9 = *(undefined8 *)((pcVar14->data)._M_elems + 0xc);
        uVar10 = *(undefined8 *)((pcVar14->data)._M_elems + 0xe);
        local_108.data._M_elems[0xc] = (uint)uVar9;
        local_108.data._M_elems[0xd] = (uint)((ulong)uVar9 >> 0x20);
        local_108.data._M_elems._56_5_ = SUB85(uVar10,0);
        local_108.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
        local_108.data._M_elems[8] = (uint)uVar7;
        local_108.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
        local_108.data._M_elems[10] = (uint)uVar8;
        local_108.data._M_elems[0xb] = (uint)((ulong)uVar8 >> 0x20);
        local_108.data._M_elems[4] = (uint)uVar5;
        local_108.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
        local_108.data._M_elems[6] = (uint)uVar6;
        local_108.data._M_elems[7] = (uint)((ulong)uVar6 >> 0x20);
        local_108.data._M_elems[0] = (uint)uVar3;
        local_108.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
        local_108.data._M_elems[2] = (uint)uVar4;
        local_108.data._M_elems[3] = (uint)((ulong)uVar4 >> 0x20);
        pcVar14 = &local_108;
        if (bVar2) {
          pcVar14 = &local_258;
        }
        local_108.exp = pcVar14->exp;
        pcVar14 = &local_108;
        if (bVar2) {
          pcVar14 = &local_258;
        }
        local_108.neg = pcVar14->neg;
        uVar16 = CONCAT44((int)((uint)bVar2 << 0x1f) >> 0x1f,(int)((uint)bVar2 << 0x1f) >> 0x1f);
        local_108._72_8_ = ~uVar16 & local_108._72_8_ | local_258._72_8_ & uVar16;
        pcVar14 = &up[iVar13].m_backend;
        local_1c0._0_4_ = cpp_dec_float_finite;
        local_1c0._4_4_ = 0x10;
        local_208 = (undefined1  [16])0x0;
        local_1f8 = (undefined1  [16])0x0;
        local_1e8 = (undefined1  [16])0x0;
        local_1d8[0] = 0;
        local_1d8[1] = 0;
        stack0xfffffffffffffe30 = 0;
        uStack_1cb = 0;
        iStack_1c8 = 0;
        bStack_1c4 = false;
        if ((cpp_dec_float<100U,_int,_void> *)local_208 == &vec[iVar13].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    ((cpp_dec_float<100U,_int,_void> *)local_208,pcVar14);
          if (local_208._0_4_ != 0 || (fpclass_type)local_1c0 != cpp_dec_float_finite) {
            bStack_1c4 = (bool)(bStack_1c4 ^ 1);
          }
        }
        else {
          if ((cpp_dec_float<100U,_int,_void> *)local_208 != pcVar14) {
            local_208 = *(undefined1 (*) [16])(pcVar14->data)._M_elems;
            local_1f8 = *(undefined1 (*) [16])((pcVar14->data)._M_elems + 4);
            local_1e8 = *(undefined1 (*) [16])((pcVar14->data)._M_elems + 8);
            local_1d8._0_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 0xc);
            uVar3 = *(undefined8 *)((pcVar14->data)._M_elems + 0xe);
            stack0xfffffffffffffe30 = (undefined5)uVar3;
            uStack_1cb = (undefined3)((ulong)uVar3 >> 0x28);
            iStack_1c8 = pcVar14->exp;
            bStack_1c4 = pcVar14->neg;
            local_1c0._0_4_ = pcVar14->fpclass;
            local_1c0._4_4_ = pcVar14->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    ((cpp_dec_float<100U,_int,_void> *)local_208,&vec[iVar13].m_backend);
        }
        auVar11 = local_1e8;
        local_170._0_4_ = cpp_dec_float_finite;
        local_170._4_4_ = 0x10;
        local_1b8 = (undefined1  [16])0x0;
        local_1a8 = (undefined1  [16])0x0;
        local_198[0] = 0;
        local_198[1] = 0;
        local_198[2] = 0;
        local_198[3] = 0;
        local_198[4] = 0;
        local_198[5] = 0;
        local_198[6] = 0;
        local_198[7] = 0;
        local_198[8] = 0;
        bStack_174 = false;
        v = (cpp_dec_float<100U,_int,_void> *)local_208;
        if ((cpp_dec_float<100U,_int,_void> *)local_1b8 != local_160) {
          local_198[4] = (uint)local_1d8._0_8_;
          local_198[5] = SUB84(local_1d8._0_8_,4);
          local_198[6] = (uint)stack0xfffffffffffffe30;
          local_198[7] = (uint)(CONCAT35(uStack_1cb,stack0xfffffffffffffe30) >> 0x20);
          local_198[0] = local_1e8._0_4_;
          local_198[1] = local_1e8._4_4_;
          local_198[2] = auVar11._8_4_;
          local_198[3] = auVar11._12_4_;
          local_1a8 = local_1f8;
          local_1b8 = local_208;
          local_198[8] = iStack_1c8;
          bStack_174 = bStack_1c4;
          local_170._0_4_ = (fpclass_type)local_1c0;
          local_170._4_4_ = local_1c0._4_4_;
          v = local_160;
        }
        local_1e8 = auVar11;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  ((cpp_dec_float<100U,_int,_void> *)local_1b8,v);
        local_260._0_4_ = cpp_dec_float_finite;
        local_260._4_4_ = 0x10;
        local_2a8 = (undefined1  [16])0x0;
        local_298 = (undefined1  [16])0x0;
        local_288 = (undefined1  [16])0x0;
        local_278[0] = 0;
        local_278[1] = 0;
        stack0xfffffffffffffd90 = 0;
        uStack_26b = 0;
        iStack_268 = 0;
        bStack_264 = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  ((cpp_dec_float<100U,_int,_void> *)local_2a8,
                   (cpp_dec_float<100U,_int,_void> *)local_1b8,&local_258);
        idx = local_b0;
        local_258.data._M_elems[0xc] = (uint)local_278._0_8_;
        local_258.data._M_elems[0xd] = SUB84(local_278._0_8_,4);
        local_258.data._M_elems._56_5_ = stack0xfffffffffffffd90;
        local_258.data._M_elems[0xf]._1_3_ = uStack_26b;
        local_258.data._M_elems[8] = local_288._0_4_;
        local_258.data._M_elems[9] = local_288._4_4_;
        local_258.data._M_elems[10] = local_288._8_4_;
        local_258.data._M_elems[0xb] = local_288._12_4_;
        local_258.data._M_elems[4] = local_298._0_4_;
        local_258.data._M_elems[5] = local_298._4_4_;
        local_258.data._M_elems[6] = local_298._8_4_;
        local_258.data._M_elems[7] = local_298._12_4_;
        local_258.data._M_elems[0] = local_2a8._0_4_;
        local_258.data._M_elems[1] = local_2a8._4_4_;
        local_258.data._M_elems[2] = local_2a8._8_4_;
        local_258.data._M_elems[3] = local_2a8._12_4_;
        local_258.exp = iStack_268;
        local_258.neg = bStack_264;
        local_258.fpclass = (fpclass_type)local_260;
        local_258.prec_elem = local_260._4_4_;
        if ((((fpclass_type)local_260 != cpp_dec_float_NaN) &&
            (local_158.fpclass != cpp_dec_float_NaN)) &&
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_258,&local_158), iVar13 < 0)) {
          ::soplex::infinity::__tls_init();
          local_260._0_4_ = cpp_dec_float_finite;
          local_260._4_4_ = 0x10;
          local_2a8 = ZEXT816(0);
          local_298 = ZEXT816(0);
          local_288 = ZEXT816(0);
          local_278[0] = 0;
          local_278[1] = 0;
          stack0xfffffffffffffd90 = 0;
          uStack_26b = 0;
          iStack_268 = 0;
          bStack_264 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_2a8,local_98);
          if (((pcVar14->fpclass != cpp_dec_float_NaN) &&
              ((fpclass_type)local_260 != cpp_dec_float_NaN)) &&
             (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (pcVar14,(cpp_dec_float<100U,_int,_void> *)local_2a8), iVar13 < 0))
          {
LAB_00481c57:
            local_158.data._M_elems[1] = local_258.data._M_elems[1];
            local_158.data._M_elems[0] = local_258.data._M_elems[0];
            local_158.data._M_elems[3] = local_258.data._M_elems[3];
            local_158.data._M_elems[2] = local_258.data._M_elems[2];
            local_158.data._M_elems[5] = local_258.data._M_elems[5];
            local_158.data._M_elems[4] = local_258.data._M_elems[4];
            local_158.data._M_elems[7] = local_258.data._M_elems[7];
            local_158.data._M_elems[6] = local_258.data._M_elems[6];
            local_158.data._M_elems[9] = local_258.data._M_elems[9];
            local_158.data._M_elems[8] = local_258.data._M_elems[8];
            local_158.data._M_elems[0xb] = local_258.data._M_elems[0xb];
            local_158.data._M_elems[10] = local_258.data._M_elems[10];
            local_158.data._M_elems[0xd] = local_258.data._M_elems[0xd];
            local_158.data._M_elems[0xc] = local_258.data._M_elems[0xc];
            local_158.data._M_elems._56_5_ = local_258.data._M_elems._56_5_;
            local_158.data._M_elems[0xf]._1_3_ = local_258.data._M_elems[0xf]._1_3_;
            local_158.exp = local_258.exp;
            local_158.neg = local_258.neg;
            local_158.fpclass = local_258.fpclass;
            local_158.prec_elem = local_258.prec_elem;
          }
        }
      }
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  *(undefined8 *)((local_b8->m_backend).data._M_elems + 0xc) = local_158.data._M_elems._48_8_;
  *(ulong *)((local_b8->m_backend).data._M_elems + 0xe) =
       CONCAT35(local_158.data._M_elems[0xf]._1_3_,local_158.data._M_elems._56_5_);
  *(undefined8 *)((local_b8->m_backend).data._M_elems + 8) = local_158.data._M_elems._32_8_;
  *(undefined8 *)((local_b8->m_backend).data._M_elems + 10) = local_158.data._M_elems._40_8_;
  *(undefined8 *)((local_b8->m_backend).data._M_elems + 4) = local_158.data._M_elems._16_8_;
  *(undefined8 *)((local_b8->m_backend).data._M_elems + 6) = local_158.data._M_elems._24_8_;
  *(undefined8 *)(local_b8->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
  *(undefined8 *)((local_b8->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_;
  (local_b8->m_backend).exp = local_158.exp;
  (local_b8->m_backend).neg = local_158.neg;
  (local_b8->m_backend).fpclass = local_158.fpclass;
  (local_b8->m_backend).prec_elem = local_158.prec_elem;
  return -1;
}

Assistant:

int SPxHarrisRT<R>::maxDelta(
   R* /*max*/,             /* max abs value in upd */
   R* val,             /* initial and chosen value */
   int num,             /* # of indices in idx */
   const int* idx,             /* nonzero indices in upd */
   const R* upd,             /* update VectorBase<R> for vec */
   const R* vec,             /* current VectorBase<R> */
   const R* low,             /* lower bounds for vec */
   const R* up               /* upper bounds for vec */
)  const
{
   R x;
   R theval;
   /**@todo patch suggests using *max instead of themax */
   R themax;
   int sel;
   int i;
   R epsilon = this->tolerances()->epsilon();

   assert(*val >= 0);

   theval = *val;
   themax = 0;
   sel = -1;

   while(num--)
   {
      i = idx[num];
      x = upd[i];

      if(x > epsilon)
      {
         themax = (x > themax) ? x : themax;
         x = (up[i] - vec[i] + this->delta) / x;

         if(x < theval && up[i] < R(infinity))
            theval = x;
      }
      else if(x < -epsilon)
      {
         themax = (-x > themax) ? -x : themax;
         x = (low[i] - vec[i] - this->delta) / x;

         if(x < theval && low[i] > R(-infinity))
            theval = x;
      }
   }

   *val = theval;
   return sel;
}